

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O2

S2Point * __thiscall
S2ShapeIndex::IteratorBase::center(S2Point *__return_storage_ptr__,IteratorBase *this)

{
  S2LogMessage local_18;
  
  local_18._0_8_ = (this->id_).id_;
  if (local_18._0_8_ != 0xffffffffffffffff) {
    S2CellId::ToPoint(__return_storage_ptr__,(S2CellId *)&local_18);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index.h"
             ,0x2bf,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_18.stream_,"Check failed: !done() ");
  abort();
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::done() const {
  return id_ == S2CellId::Sentinel();
}